

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O0

uint scan_uint(char *str)

{
  uint local_1c;
  char *pcStack_18;
  uint num;
  char *s;
  char *str_local;
  
  local_1c = 0;
  for (pcStack_18 = str; ((*pcStack_18 != '\0' && ('/' < *pcStack_18)) && (*pcStack_18 < ':'));
      pcStack_18 = pcStack_18 + 1) {
    local_1c = *pcStack_18 + -0x30 + local_1c * 10;
  }
  return local_1c;
}

Assistant:

static unsigned int scan_uint(const char *str) {
    const char *s = str;
    unsigned int num = 0;
    while(*s) {
        if(*s < 48 || *s > 57) break;
        num *= 10;
        num += (*s - 48);
        s++;
    }

    return num;
}